

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VWAP.cpp
# Opt level: O2

double __thiscall VWAPOption::simulateSinglePath(VWAPOption *this)

{
  double dVar1;
  int i;
  int iVar2;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_13c8;
  double local_13c0;
  mt19937 gen;
  
  this_00 = &gen;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,0xffffffffffffff95);
  dVar8 = this->S0_;
  dVar9 = this->X0_;
  local_13c0 = dVar8 * dVar9 * dVar9;
  local_13c8 = dVar9 * dVar9;
  dVar1 = this->a_;
  dVar3 = exp(-this->lambda_ * this->delta_);
  dVar10 = this->lambda_;
  dVar7 = this->sigmaVol_;
  dVar4 = exp(dVar10 * -2.0 * this->delta_);
  dVar10 = (1.0 - dVar4) * ((dVar7 * dVar7) / (dVar10 + dVar10));
  for (iVar2 = 1; iVar2 <= this->numIncrements_; iVar2 = iVar2 + 1) {
    dVar7 = this->sigmaPrice_;
    dVar4 = this->delta_;
    dVar6 = this->mu_;
    if (dVar4 < 0.0) {
      dVar5 = sqrt(dVar4);
    }
    else {
      dVar5 = SQRT(dVar4);
    }
    dVar4 = exp((dVar7 * -0.5 * dVar7 + dVar6) * dVar4 + dVar7 * dVar5);
    dVar6 = GetNormDistrDouble((VWAPOption *)this_00,&gen);
    dVar5 = exp(-this->lambda_ * this->delta_);
    dVar7 = SQRT(dVar10);
    if (dVar10 < 0.0) {
      dVar7 = sqrt(dVar10);
    }
    dVar8 = dVar8 * dVar4 * dVar6;
    dVar4 = GetNormDistrDouble((VWAPOption *)this_00,&gen);
    dVar9 = dVar9 * dVar5 + (1.0 - dVar3) * dVar1 + dVar4 * dVar7;
    local_13c0 = local_13c0 + dVar8 * dVar9 * dVar9;
    local_13c8 = local_13c8 + dVar9 * dVar9;
  }
  return local_13c0 / local_13c8;
}

Assistant:

double VWAPOption::simulateSinglePath() {
    int seed = -107;
    std::mt19937 gen(seed);

    double sumStUt = S0_*X0_*X0_;
    double sumUt   = X0_*X0_;

    double Sti = S0_;
    double Xti = X0_;
    double Uti = 0.0;
    const double muX = a_*(1-exp(-lambda_ * delta_));
    const double sigmaX2 = pow(sigmaVol_,2)/(2*lambda_)*(1-exp(-2*lambda_*delta_));

    //simulate path over [0,T]
    for (int i = 1; i <= numIncrements_; i++) {
        Sti = Sti*exp((mu_-0.5*sigmaPrice_*sigmaPrice_)*delta_
                      + sigmaPrice_*sqrt(delta_))*GetNormDistrDouble(gen);

        Xti = exp(-lambda_*delta_)*Xti + muX + sqrt(sigmaX2)*GetNormDistrDouble(gen);
        Uti = pow(Xti,2);

        sumStUt+= Sti*Uti;
        sumUt += Uti;
    }

    return (sumStUt/sumUt);
}